

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnforcePortSuffix.cpp
# Opt level: O0

bool __thiscall EnforcePortSuffix::check(EnforcePortSuffix *this,RootSymbol *root)

{
  bool bVar1;
  MainVisitor *in_RDI;
  MainVisitor visitor;
  Diagnostics *in_stack_ffffffffffffffc8;
  MainVisitor *in_stack_ffffffffffffffd8;
  Symbol *in_stack_ffffffffffffffe0;
  
  enforce_port_suffix::MainVisitor::MainVisitor(in_RDI,in_stack_ffffffffffffffc8);
  slang::ast::Symbol::visit<enforce_port_suffix::MainVisitor&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = slang::SmallVectorBase<slang::Diagnostic>::empty
                    ((SmallVectorBase<slang::Diagnostic> *)&(in_RDI->super_TidyVisitor).diags);
  return bVar1;
}

Assistant:

bool check(const ast::RootSymbol& root) override {
        MainVisitor visitor(diagnostics);
        root.visit(visitor);
        return diagnostics.empty();
    }